

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O1

int opn2_getBankId(OPN2_MIDIPlayer *device,OPN2_Bank *bank,OPN2_BankId *id)

{
  ulong uVar1;
  int iVar2;
  
  iVar2 = -1;
  if (bank != (OPN2_Bank *)0x0 && device != (OPN2_MIDIPlayer *)0x0) {
    uVar1 = *(ulong *)((long)bank->pointer[1] + 0x10);
    id->msb = (byte)(uVar1 >> 8) & 0x7f;
    id->lsb = (byte)uVar1 & 0x7f;
    id->percussive = (byte)(uVar1 >> 0xf) & 1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

OPNMIDI_EXPORT int opn2_getBankId(OPN2_MIDIPlayer *device, const OPN2_Bank *bank, OPN2_BankId *id)
{
    if(!device || !bank)
        return -1;

    Synth::BankMap::iterator it = Synth::BankMap::iterator::from_ptrs(bank->pointer);
    Synth::BankMap::key_type idnumber = it->first;
    id->msb = (idnumber >> 8) & 127;
    id->lsb = idnumber & 127;
    id->percussive = (idnumber & Synth::PercussionTag) ? 1 : 0;
    return 0;
}